

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O0

void Search::hoopla_permute(size_t *B,size_t *end)

{
  long lVar1;
  unsigned_long *__ptr;
  size_t a;
  size_t b;
  size_t a_00;
  size_t sVar2;
  size_t a_01;
  long in_RSI;
  unsigned_long *in_RDI;
  size_t mx;
  size_t d4;
  size_t d3;
  size_t d2;
  size_t d1;
  size_t j;
  size_t i;
  size_t hi;
  size_t lo;
  size_t *A;
  size_t N;
  size_t in_stack_00000158;
  _func_bool_unsigned_long_unsigned_long *in_stack_ffffffffffffffa0;
  unsigned_long *in_stack_ffffffffffffffa8;
  unsigned_long *in_stack_ffffffffffffffb0;
  ulong local_40;
  long local_38;
  long local_30;
  long local_28;
  
  lVar1 = in_RSI - (long)in_RDI >> 3;
  std::sort<unsigned_long*,bool(*)(unsigned_long,unsigned_long)>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  __ptr = calloc_or_throw<unsigned_long>(in_stack_00000158);
  __ptr[lVar1] = *in_RDI;
  __ptr[lVar1 + 1] = in_RDI[lVar1 + -1];
  local_30 = lVar1 + 1;
  local_38 = 0;
  local_40 = lVar1 - 1;
  local_28 = lVar1;
  while (local_38 + 1U < local_40) {
    a = absdiff(__ptr[local_28],in_RDI[local_38 + 1]);
    b = absdiff(__ptr[local_28],in_RDI[local_40 - 1]);
    a_00 = absdiff(__ptr[local_30],in_RDI[local_38 + 1]);
    sVar2 = absdiff(__ptr[local_30],in_RDI[local_40 - 1]);
    a_01 = max(a,b);
    sVar2 = max(a_00,sVar2);
    sVar2 = max(a_01,sVar2);
    if (a < sVar2) {
      if (b < sVar2) {
        if (a_00 < sVar2) {
          __ptr[local_30 + 1] = in_RDI[local_40 - 1];
          local_40 = local_40 - 1;
        }
        else {
          __ptr[local_30 + 1] = in_RDI[local_38 + 1];
          local_38 = local_38 + 1;
        }
        local_30 = local_30 + 1;
      }
      else {
        __ptr[local_28 + -1] = in_RDI[local_40 - 1];
        local_40 = local_40 - 1;
        local_28 = local_28 + -1;
      }
    }
    else {
      __ptr[local_28 + -1] = in_RDI[local_38 + 1];
      local_38 = local_38 + 1;
      local_28 = local_28 + -1;
    }
  }
  memcpy(in_RDI,__ptr + local_28,lVar1 << 3);
  free(__ptr);
  return;
}

Assistant:

void hoopla_permute(size_t* B, size_t* end)
{
  // from Curtis IPL 2004, "Darts and hoopla board design"
  // first sort
  size_t N = end - B;
  std::sort(B, end, cmp_size_t);
  // make some temporary space
  size_t* A = calloc_or_throw<size_t>((N + 1) * 2);
  A[N] = B[0];                // arbitrarily choose the maximum in the middle
  A[N + 1] = B[N - 1];        // so the maximum goes next to it
  size_t lo = N, hi = N + 1;  // which parts of A have we filled in? [lo,hi]
  size_t i = 0, j = N - 1;    // which parts of B have we already covered? [0,i] and [j,N-1]
  while (i + 1 < j)
  {
    // there are four options depending on where things get placed
    size_t d1 = absdiff(A[lo], B[i + 1]);  // put B[i+1] at the bottom
    size_t d2 = absdiff(A[lo], B[j - 1]);  // put B[j-1] at the bottom
    size_t d3 = absdiff(A[hi], B[i + 1]);  // put B[i+1] at the top
    size_t d4 = absdiff(A[hi], B[j - 1]);  // put B[j-1] at the top
    size_t mx = max(max(d1, d2), max(d3, d4));
    if (d1 >= mx)
      A[--lo] = B[++i];
    else if (d2 >= mx)
      A[--lo] = B[--j];
    else if (d3 >= mx)
      A[++hi] = B[++i];
    else
      A[++hi] = B[--j];
  }
  // copy it back to B
  memcpy(B, A + lo, N * sizeof(size_t));
  // clean up
  free(A);
}